

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O1

Matrix3d * __thiscall Pose::QtoR(Matrix3d *__return_storage_ptr__,Pose *this,Vector4d *Q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double R33;
  double R23;
  double R13;
  double R32;
  double R22;
  double R31;
  double R21;
  double R12;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_30;
  double local_10;
  
  dVar1 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar3 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar4 = (Q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  dVar6 = dVar2 * dVar2 * -2.0;
  dVar7 = dVar1 + dVar1;
  local_60 = (dVar2 + dVar2) * dVar3;
  dVar8 = dVar3 * dVar3 * -2.0;
  local_10 = (dVar3 + dVar3) * dVar4;
  local_38 = dVar7 * dVar2 + local_10;
  local_58 = (dVar2 + dVar2) * dVar4;
  local_40 = dVar7 * dVar3 - local_58;
  local_10 = dVar7 * dVar2 - local_10;
  local_68 = 1.0 - (dVar1 * dVar1 + dVar1 * dVar1);
  local_48 = dVar8 + local_68;
  local_50 = local_60 + dVar7 * dVar4;
  local_58 = dVar7 * dVar3 + local_58;
  local_60 = local_60 - dVar7 * dVar4;
  local_68 = local_68 + dVar6;
  local_30.m_row = 0;
  local_30.m_col = 1;
  local_30.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar6 + 1.0 + dVar8;
  local_30.m_xpr = __return_storage_ptr__;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_30,&local_10);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_58);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_38);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_48);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_60);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_40);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_50);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_68);
  if ((local_30.m_currentBlockRows + local_30.m_row == 3) && (local_30.m_col == 3)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

Matrix3d Pose::QtoR(Vector4d Q){
      // Transform quaternion to rotation matrix
      double x, y, z, w;
      double R11, R21, R31, R12, R22, R32, R13, R23, R33;
      // Read components of quaternion
      x = Q(0);
      y = Q(1);
      z = Q(2);
      w = Q(3);
      // R11 = 1 - 2y^2 - 2z^2
      R11 = 1 - 2*pow(y,2) - 2*pow(z,2);
      // R21 = 2xy + 2zw
      R21 = 2*x*y + 2*z*w;
      // R31 = 2xz - 2yw
      R31 = 2*x*z - 2*y*w;
      // R12 = 2xy - 2zw
      R12 = 2*x*y - 2*z*w;
      // R22 = 1 - 2x^2 - 2z^2
      R22 = 1 - 2*pow(x,2) - 2*pow(z,2);
      // R32 = 2yz + 2xw
      R32 = 2*y*z + 2*x*w;
      // R13 = 2xz + 2yw
      R13 = 2*x*z + 2*y*w;
      // R23 = 2yz - 2xw
      R23 = 2*y*z - 2*x*w;
      // R33 = 1 - 2x^2 - 2y^2
      R33 = 1 - 2*pow(x,2) - 2*pow(y,2);
      // Define rotation matrix
      Matrix3d R;
      R <<  R11, R12, R13,
            R21, R22, R23,
            R31, R32, R33;
      // Return rotation matrix
      return R;
}